

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

void Fraig_TablePrintStatsF(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  uint uVar3;
  long lVar4;
  
  pFVar1 = pMan->pTableF;
  printf("Functional table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  for (lVar4 = 0; lVar4 < pFVar1->nBins; lVar4 = lVar4 + 1) {
    ppFVar2 = pFVar1->pBins + lVar4;
    uVar3 = 0;
    while( true ) {
      if (*ppFVar2 == (Fraig_Node_t *)0x0) break;
      uVar3 = uVar3 + 1;
      ppFVar2 = &(*ppFVar2)->pNextF;
    }
    if (1 < uVar3) {
      printf("{%d} ");
    }
  }
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsF( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Functional table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
            printf( "{%d} ", Counter );
    }
    printf( "\n" );
}